

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pcmpeqh_mips(uint64_t fs,uint64_t ft)

{
  return CONCAT26(-(ushort)((short)(ft >> 0x30) == (short)(fs >> 0x30)),
                  CONCAT24(-(ushort)((short)(ft >> 0x20) == (short)(fs >> 0x20)),
                           CONCAT22(-(ushort)((short)(ft >> 0x10) == (short)(fs >> 0x10)),
                                    -(ushort)((short)ft == (short)fs))));
}

Assistant:

uint64_t helper_pcmpeqh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.uh[i] = -(vs.uh[i] == vt.uh[i]);
    }
    return vs.d;
}